

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  size_type *psVar7;
  Result *_result;
  uint64_t expectedUnits;
  undefined1 *from;
  long lVar8;
  long lVar9;
  InternalMetadata *pIVar10;
  undefined1 *puVar11;
  string err;
  BiDirectionalLSTMLayerParams recurrent;
  LSTMParams lstmParams;
  string local_188;
  string local_168;
  uint64_t local_148;
  Type *local_140;
  Type *local_138;
  string local_130;
  uint64_t local_110;
  string local_108;
  undefined1 local_e8 [48];
  int local_b8;
  RepeatedPtrFieldBase local_a8;
  LSTMParams *local_90;
  uint64_t local_88;
  uint64_t local_80;
  LSTMParams local_70;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,5);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,5,5);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"BiDirectionalLSTM","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_108,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"BiDirectionalLSTM","");
    validateRankCount(__return_storage_ptr__,layer,(string *)local_e8,5,5,&this->blobNameToRank);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    bVar4 = Result::good(__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar10 = &(((BatchnormLayerParams *)puVar11)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar11)->mean_ == (WeightParams *)0x0) {
    pIVar10 = (InternalMetadata *)0x0;
  }
  lVar8 = (long)*(int *)&(((ConvolutionLayerParams *)puVar11)->kernelsize_).arena_or_elements_;
  bVar4 = lVar8 == 0;
  if (!bVar4) {
    lVar9 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar10->ptr_ + lVar9));
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 8;
      bVar4 = lVar8 * 8 == lVar9;
    } while (!bVar4);
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar10 = &(((GRULayerParams *)puVar11)->outputgateweightmatrix_->super_MessageLite).
             _internal_metadata_;
  if (((GRULayerParams *)puVar11)->outputgateweightmatrix_ == (WeightParams *)0x0) {
    pIVar10 = (InternalMetadata *)0x0;
  }
  lVar8 = (long)*(int *)&(((ConvolutionLayerParams *)puVar11)->stride_).arena_or_elements_;
  bVar4 = lVar8 == 0;
  if (!bVar4) {
    lVar9 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar10->ptr_ + lVar9));
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 8;
      bVar4 = lVar8 * 8 == lVar9;
    } while (!bVar4);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  from = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar11)->params_;
  puVar11 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar11)->weightparams_;
  if ((LSTMWeightParams *)puVar11 == (LSTMWeightParams *)0x0) {
    puVar11 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)from == (LSTMParams *)0x0) {
    from = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)from);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar11,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar11 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)local_e8,(BiDirectionalLSTMLayerParams *)puVar11);
  puVar11 = (undefined1 *)local_90;
  if (local_90 == (LSTMParams *)0x0) {
    puVar11 = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_70,(LSTMParams *)puVar11);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (local_e8._24_4_ == 3) {
    if (local_b8 == 3) {
      local_148 = local_80;
      local_138 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&local_a8,0);
      local_140 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&local_a8,1);
      puVar11 = (undefined1 *)local_138->inputgateweightmatrix_;
      if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
        puVar11 = Specification::_WeightParams_default_instance_;
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Bidirectional LSTM","");
      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"forward input gate weight matrix","");
      expectedUnits = local_88 * local_148;
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,local_148,&local_188,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        puVar11 = (undefined1 *)local_138->forgetgateweightmatrix_;
        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
          puVar11 = Specification::_WeightParams_default_instance_;
        }
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"Bidirectional LSTM","");
        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"forward forget gate weight matrix","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,local_148,&local_188
                   ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (bVar4) {
          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != paVar1) {
            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
          }
          puVar11 = (undefined1 *)local_138->blockinputweightmatrix_;
          if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
            puVar11 = Specification::_WeightParams_default_instance_;
          }
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_188,"Bidirectional LSTM","");
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"forward block input gate weight matrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,local_148,
                     &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good(__return_storage_ptr__);
          if (bVar4) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            puVar11 = (undefined1 *)local_138->outputgateweightmatrix_;
            if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
              puVar11 = Specification::_WeightParams_default_instance_;
            }
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"Bidirectional LSTM","");
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"forward output gate weight matrix","");
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,local_148,
                       &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (bVar4) {
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              puVar11 = (undefined1 *)local_138->inputgaterecursionmatrix_;
              if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                puVar11 = Specification::_WeightParams_default_instance_;
              }
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_188,"Bidirectional LSTM","");
              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_168,"forward input gate recursion matrix","");
              local_110 = local_148 * local_148;
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar11,local_110,local_148,
                         &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              bVar4 = Result::good(__return_storage_ptr__);
              if (bVar4) {
                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 != paVar1) {
                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                }
                puVar11 = (undefined1 *)local_138->forgetgaterecursionmatrix_;
                if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                  puVar11 = Specification::_WeightParams_default_instance_;
                }
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_188,"Bidirectional LSTM","");
                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_168,"forward forget gate recursion matrix","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar11,local_110,local_148,
                           &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                bVar4 = Result::good(__return_storage_ptr__);
                if (bVar4) {
                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2 != paVar1) {
                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                  }
                  puVar11 = (undefined1 *)local_138->blockinputrecursionmatrix_;
                  if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                    puVar11 = Specification::_WeightParams_default_instance_;
                  }
                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_188,"Bidirectional LSTM","");
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_168,"forward block input gate recursion matrix","");
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar11,local_110,local_148,
                             &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good(__return_storage_ptr__);
                  if (bVar4) {
                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2 != paVar1) {
                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                    }
                    puVar11 = (undefined1 *)local_138->outputgaterecursionmatrix_;
                    if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                      puVar11 = Specification::_WeightParams_default_instance_;
                    }
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"Bidirectional LSTM","");
                    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_168,"forward output gate recursion matrix","");
                    validateGeneralWeightParams
                              (__return_storage_ptr__,(WeightParams *)puVar11,local_110,local_148,
                               &local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      local_188.field_2._M_allocated_capacity + 1);
                    }
                    bVar4 = Result::good(__return_storage_ptr__);
                    if (bVar4) {
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar11 = (undefined1 *)local_140->inputgateweightmatrix_;
                      if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                        puVar11 = Specification::_WeightParams_default_instance_;
                      }
                      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_188,"Bidirectional LSTM","");
                      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_168,"backward input gate weight matrix","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,
                                 local_148,&local_188,(string *)((ulong)pvVar3 & 0xfffffffffffffffe)
                                 ,&local_168);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168._M_dataplus._M_p != &local_168.field_2) {
                        operator_delete(local_168._M_dataplus._M_p,
                                        local_168.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_188._M_dataplus._M_p != &local_188.field_2) {
                        operator_delete(local_188._M_dataplus._M_p,
                                        local_188.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = Result::good(__return_storage_ptr__);
                      if (bVar4) {
                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar2 != paVar1) {
                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                        }
                        puVar11 = (undefined1 *)local_140->forgetgateweightmatrix_;
                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                          puVar11 = Specification::_WeightParams_default_instance_;
                        }
                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_188,"Bidirectional LSTM","");
                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_168,"backward forget gate weight matrix","");
                        validateGeneralWeightParams
                                  (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,
                                   local_148,&local_188,
                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                          operator_delete(local_168._M_dataplus._M_p,
                                          local_168.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                          operator_delete(local_188._M_dataplus._M_p,
                                          local_188.field_2._M_allocated_capacity + 1);
                        }
                        bVar4 = Result::good(__return_storage_ptr__);
                        if (bVar4) {
                          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)pcVar2 != paVar1) {
                            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                          }
                          puVar11 = (undefined1 *)local_140->blockinputweightmatrix_;
                          if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                            puVar11 = Specification::_WeightParams_default_instance_;
                          }
                          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_188,"Bidirectional LSTM","");
                          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_168,"backward block input gate weight matrix",
                                     "");
                          validateGeneralWeightParams
                                    (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,
                                     local_148,&local_188,
                                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_168._M_dataplus._M_p != &local_168.field_2) {
                            operator_delete(local_168._M_dataplus._M_p,
                                            local_168.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_188._M_dataplus._M_p != &local_188.field_2) {
                            operator_delete(local_188._M_dataplus._M_p,
                                            local_188.field_2._M_allocated_capacity + 1);
                          }
                          bVar4 = Result::good(__return_storage_ptr__);
                          if (bVar4) {
                            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)pcVar2 != paVar1) {
                              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                            }
                            puVar11 = (undefined1 *)local_140->outputgateweightmatrix_;
                            if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                              puVar11 = Specification::_WeightParams_default_instance_;
                            }
                            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_188,"Bidirectional LSTM","");
                            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_168,"backward output gate weight matrix","")
                            ;
                            validateGeneralWeightParams
                                      (__return_storage_ptr__,(WeightParams *)puVar11,expectedUnits,
                                       local_148,&local_188,
                                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
                              operator_delete(local_168._M_dataplus._M_p,
                                              local_168.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
                              operator_delete(local_188._M_dataplus._M_p,
                                              local_188.field_2._M_allocated_capacity + 1);
                            }
                            bVar4 = Result::good(__return_storage_ptr__);
                            if (bVar4) {
                              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)pcVar2 != paVar1) {
                                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                              }
                              puVar11 = (undefined1 *)local_140->inputgaterecursionmatrix_;
                              if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                puVar11 = Specification::_WeightParams_default_instance_;
                              }
                              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_188,"Bidirectional LSTM","");
                              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_168,"backward input gate recursion matrix"
                                         ,"");
                              validateGeneralWeightParams
                                        (__return_storage_ptr__,(WeightParams *)puVar11,local_110,
                                         local_148,&local_188,
                                         (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                operator_delete(local_168._M_dataplus._M_p,
                                                local_168.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                operator_delete(local_188._M_dataplus._M_p,
                                                local_188.field_2._M_allocated_capacity + 1);
                              }
                              bVar4 = Result::good(__return_storage_ptr__);
                              if (bVar4) {
                                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)pcVar2 != paVar1) {
                                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                }
                                puVar11 = (undefined1 *)local_140->forgetgaterecursionmatrix_;
                                if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                  puVar11 = Specification::_WeightParams_default_instance_;
                                }
                                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_188,"Bidirectional LSTM","");
                                pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_168,
                                           "backward forget gate recursion matrix","");
                                validateGeneralWeightParams
                                          (__return_storage_ptr__,(WeightParams *)puVar11,local_110,
                                           local_148,&local_188,
                                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_168
                                          );
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                  operator_delete(local_168._M_dataplus._M_p,
                                                  local_168.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                  operator_delete(local_188._M_dataplus._M_p,
                                                  local_188.field_2._M_allocated_capacity + 1);
                                }
                                bVar4 = Result::good(__return_storage_ptr__);
                                if (bVar4) {
                                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)pcVar2 != paVar1) {
                                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                  }
                                  puVar11 = (undefined1 *)local_140->blockinputrecursionmatrix_;
                                  if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                    puVar11 = Specification::_WeightParams_default_instance_;
                                  }
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_188,"Bidirectional LSTM","");
                                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_168,
                                             "backward block input gate recursion matrix","");
                                  validateGeneralWeightParams
                                            (__return_storage_ptr__,(WeightParams *)puVar11,
                                             local_110,local_148,&local_188,
                                             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                             &local_168);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  bVar4 = Result::good(__return_storage_ptr__);
                                  if (bVar4) {
                                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)pcVar2 != paVar1) {
                                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                    }
                                    puVar11 = (undefined1 *)local_140->outputgaterecursionmatrix_;
                                    if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                      puVar11 = Specification::_WeightParams_default_instance_;
                                    }
                                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_188,"Bidirectional LSTM","");
                                    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_168,
                                               "backward output gate recursion matrix","");
                                    validateGeneralWeightParams
                                              (__return_storage_ptr__,(WeightParams *)puVar11,
                                               local_110,local_148,&local_188,
                                               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                               &local_168);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                      operator_delete(local_168._M_dataplus._M_p,
                                                      local_168.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                      operator_delete(local_188._M_dataplus._M_p,
                                                      local_188.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar4 = Result::good(__return_storage_ptr__);
                                    if (bVar4) {
                                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)pcVar2 != paVar1) {
                                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                      }
                                      puVar11 = (undefined1 *)local_90;
                                      if (local_90 == (LSTMParams *)0x0) {
                                        puVar11 = Specification::_LSTMParams_default_instance_;
                                      }
                                      if (((LSTMParams *)puVar11)->hasbiasvectors_ == true) {
                                        puVar11 = (undefined1 *)local_138->inputgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward input gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_138->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward forget gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_138->blockinputbiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward block input bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_138->outputgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward output gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->inputgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward input gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward forget gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->blockinputbiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward block input bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->outputgatebiasvector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward output gate bias vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                      }
                                      if (local_90 == (LSTMParams *)0x0) {
                                        local_90 = (LSTMParams *)
                                                   Specification::_LSTMParams_default_instance_;
                                      }
                                      if (local_90->haspeepholevectors_ == true) {
                                        puVar11 = (undefined1 *)local_138->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward input gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_138->forgetgatepeepholevector_
                                        ;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward forget gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_138->outputgatepeepholevector_
                                        ;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "forward output gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward input gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->forgetgatepeepholevector_
                                        ;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward forget gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                        puVar11 = (undefined1 *)local_140->outputgatepeepholevector_
                                        ;
                                        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
                                          puVar11 = Specification::_WeightParams_default_instance_;
                                        }
                                        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_188,"Bidirectional LSTM","");
                                        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                                        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_168,
                                                   "backward output gate peephole vector","");
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar11,
                                                   local_148,1,&local_188,
                                                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),
                                                   &local_168);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                          operator_delete(local_168._M_dataplus._M_p,
                                                          local_168.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                          operator_delete(local_188._M_dataplus._M_p,
                                                          local_188.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                        bVar4 = Result::good(__return_storage_ptr__);
                                        if (!bVar4) goto LAB_003620c0;
                                        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus.
                                                 _M_p;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pcVar2 != paVar1) {
                                          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                                        }
                                      }
                                      Result::Result(__return_storage_ptr__);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_003620c0;
    }
    std::operator+(&local_168,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
  }
  else {
    std::operator+(&local_168,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
  }
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_188.field_2._M_allocated_capacity = *psVar7;
    local_188.field_2._8_8_ = plVar6[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar7;
    local_188._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_188._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
LAB_003620c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  Specification::LSTMParams::~LSTMParams(&local_70);
  Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 5));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 5, 5));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate weight matrix"));

    // Check forward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix"));
    // Check backward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate weight matrix"));

    // Check backward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate peephole vector"));
    }
    return Result();
}